

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QList<ClassDef::Interface>_>::relocate
          (QArrayDataPointer<QList<ClassDef::Interface>_> *this,qsizetype offset,
          QList<ClassDef::Interface> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QList<ClassDef::Interface>_> *in_RDI;
  QList<ClassDef::Interface> **unaff_retaddr;
  QList<ClassDef::Interface> *res;
  QList<ClassDef::Interface> *first;
  QArrayDataPointer<QList<ClassDef::Interface>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QList<ClassDef::Interface>,long_long>
            (first,(longlong)in_RDI,(QList<ClassDef::Interface> *)0x15f894);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QList<ClassDef::Interface>>,QList<ClassDef::Interface>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x18 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }